

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

packet_t * parse_pkt(uint8_t *data,int len)

{
  uint8_t *puVar1;
  double in_XMM0_Qa;
  packet_t *pkt;
  int len_local;
  uint8_t *data_local;
  
  if ((len < 0) && (0xffff < len)) {
    _log(in_XMM0_Qa);
    data_local = (uint8_t *)0x0;
  }
  else if (data == (uint8_t *)0x0) {
    _log(in_XMM0_Qa);
    data_local = (uint8_t *)0x0;
  }
  else {
    data_local = (uint8_t *)new(0x60);
    ((packet_t *)data_local)->len = len;
    ((packet_t *)data_local)->payload = len;
    puVar1 = (uint8_t *)new((long)len);
    ((packet_t *)data_local)->data = puVar1;
    memcpy(((packet_t *)data_local)->data,data,(long)len);
    parse_eth((packet_t *)data_local);
  }
  return (packet_t *)data_local;
}

Assistant:

packet_t *parse_pkt(const uint8_t *data, int len)
{
	if (0 > len && len > 65535) {
		log_err("%s packet len %d is invalid\n", __FUNCTION__, len);
		return NULL;
	}

	if (!data) {
		log_err("%s data is null\n",  __FUNCTION__);
		return NULL;
	}

	packet_t *pkt = _new(packet_t);
	pkt->len = len;
	pkt->payload = len;
	pkt->data = new(len);
	memcpy(pkt->data, data, len);
	parse_eth(pkt);

	return pkt;
}